

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_mean::build_graph(test_mean *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne)._M_elems);
  ggml_set_param(ctx,pgVar1);
  ggml_set_name(pgVar1,"a");
  pgVar1 = (ggml_tensor *)ggml_mean(ctx,pgVar1);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * out = ggml_mean(ctx, a);
        ggml_set_name(out, "out");

        return out;
    }